

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolk.c
# Opt level: O2

int ffpclk(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int *array,
          int *status)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long ntodo;
  long incre;
  int *local_71e0;
  double zero;
  double scale;
  int hdutype;
  int tcode;
  LONGLONG elemnum;
  uint local_71b8;
  int maxelem2;
  long local_71b0;
  int *local_71a8;
  long local_71a0;
  LONGLONG repeat;
  long twidth;
  LONGLONG rowlen;
  LONGLONG startpos;
  char cform [20];
  char tform [20];
  LONGLONG tnull;
  char snull [20];
  char message [81];
  double cbuff [3600];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_71a8 = array;
    iVar1 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,1,&scale,&zero,tform,&twidth,&tcode,
                     &maxelem2,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,
                     status);
    if (iVar1 < 1) {
      local_71b8 = colnum;
      if (tcode == 0x10) {
        ffcfmt(tform,cform);
      }
      local_71b0 = 0;
      local_71a0 = 0;
      do {
        local_71e0 = local_71a8 + local_71b0;
        do {
          if (nelem == 0) {
            if (*status != -0xb) {
              return *status;
            }
            ffpmsg("Numerical overflow during type conversion while writing FITS data.");
            *status = 0x19c;
            return 0x19c;
          }
          lVar2 = (long)maxelem2;
          if (nelem < maxelem2) {
            lVar2 = nelem;
          }
          ntodo = repeat - elemnum;
          if (lVar2 < repeat - elemnum) {
            ntodo = lVar2;
          }
          ffmbyt(fptr,elemnum * incre + rowlen * local_71a0 + startpos,1,status);
          if (tcode == 0xb) {
            ffintfi1(local_71e0,ntodo,scale,zero,(uchar *)cbuff,status);
            ffpi1b(fptr,ntodo,incre,(uchar *)cbuff,status);
          }
          else if (tcode == 0x10) {
            sVar3 = strlen(cform);
            if (((hdutype != 1) || (sVar3 < 2)) ||
               ((cform[sVar3 - 1] != 'f' && (cform[sVar3 - 1] != 'E')))) {
LAB_001da740:
              snprintf(message,0x51,"Cannot write numbers to column %d which has format %s",
                       (ulong)local_71b8,tform);
              ffpmsg(message);
              if (hdutype == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffintfstr(local_71e0,ntodo,scale,zero,cform,twidth,(char *)cbuff,status);
            if (incre - twidth == 0) {
              ffpbyt(fptr,incre * ntodo,cbuff,status);
            }
            else {
              ffpbytoff(fptr,twidth,ntodo,incre - twidth,cbuff,status);
            }
          }
          else if (tcode == 0x15) {
            ffintfi2(local_71e0,ntodo,scale,zero,(short *)cbuff,status);
            ffpi2b(fptr,ntodo,incre,(short *)cbuff,status);
          }
          else if (tcode == 0x52) {
            ffintfr8(local_71e0,ntodo,scale,zero,cbuff,status);
            ffpr8b(fptr,ntodo,incre,cbuff,status);
          }
          else if (tcode == 0x2a) {
            ffintfr4(local_71e0,ntodo,scale,zero,(float *)cbuff,status);
            ffpr4b(fptr,ntodo,incre,(float *)cbuff,status);
          }
          else if (tcode == 0x51) {
            ffintfi8(local_71e0,ntodo,scale,zero,(LONGLONG *)cbuff,status);
            ffpi8b(fptr,ntodo,incre,(long *)cbuff,status);
          }
          else {
            if (tcode != 0x29) goto LAB_001da740;
            ffintfi4(local_71e0,ntodo,scale,zero,(int *)cbuff,status);
            ffpi4b(fptr,ntodo,incre,(int *)cbuff,status);
          }
          if (0 < *status) {
            snprintf(message,0x51,
                     "Error writing elements %.0f thru %.0f of input data array (ffpclk).",
                     (double)(local_71b0 + 1),(double)(ntodo + local_71b0));
            ffpmsg(message);
            goto LAB_001da395;
          }
          nelem = nelem - ntodo;
        } while (nelem == 0);
        local_71b0 = local_71b0 + ntodo;
        elemnum = ntodo + elemnum;
        if (elemnum == repeat) {
          elemnum = 0;
          local_71a0 = local_71a0 + 1;
        }
      } while( true );
    }
LAB_001da395:
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffpclk( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            int   *array,    /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int tcode, maxelem2, hdutype, writeraw;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull, maxelem;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* call the 'short' or 'long' version of this routine, if possible */
    if (sizeof(int) == sizeof(short))
        ffpcli(fptr, colnum, firstrow, firstelem, nelem, 
              (short *) array, status);
    else if (sizeof(int) == sizeof(long))
        ffpclj(fptr, colnum, firstrow, firstelem, nelem, 
              (long *) array, status);
    else
    {
    /*
      This is a special case: sizeof(int) is not equal to sizeof(short) or
      sizeof(long).  This occurs on Alpha OSF systems where short = 2 bytes,
      int = 4 bytes, and long = 8 bytes.
    */

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem2, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);
    maxelem = maxelem2;

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*
       if there is no scaling and the native machine format is not byteswapped
       then we can simply write the raw data bytes into the FITS file if the
       datatype of the FITS column is the same as the input values.  Otherwise
       we must convert the raw values into the scaled and/or machine dependent
       format in a temporary buffer that has been allocated for this purpose.
    */
    if (scale == 1. && zero == 0. && 
       MACHINE == NATIVE && tcode == TLONG)
    {
        writeraw = 1;
        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX/4;
        }
    }
    else
        writeraw = 0;

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TLONG):
              if (writeraw)
              {
                /* write raw input bytes without conversion */
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) &array[next], status);
              }
              else
              {
                /* convert the raw data before writing to FITS file */
                ffintfi4(&array[next], ntodo, scale, zero,
                        (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
              }

                break;

            case (TLONGLONG):

                ffintfi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TBYTE):
 
                ffintfi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
                break;

            case (TSHORT):

                ffintfi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TFLOAT):

                ffintfr4(&array[next], ntodo, scale, zero,
                        (float *) buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffintfr8(&array[next], ntodo, scale, zero,
                       (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
                if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffintfstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                     "Cannot write numbers to column %d which has format %s",
                      colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpclk).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while writing FITS data.");
        *status = NUM_OVERFLOW;
    }

    }   /* end of Dec ALPHA special case */

    return(*status);
}